

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O2

void icu_63::initSingletons(char *what,UErrorCode *errorCode)

{
  int iVar1;
  Norm2AllModes *pNVar2;
  char *name;
  undefined8 *puVar3;
  
  name = "nfkc";
  iVar1 = strcmp(what,"nfkc");
  if (iVar1 == 0) {
    puVar3 = &nfkcSingleton;
  }
  else {
    name = "nfkc_cf";
    iVar1 = strcmp(what,"nfkc_cf");
    if (iVar1 != 0) goto LAB_002cd558;
    puVar3 = &nfkc_cfSingleton;
  }
  pNVar2 = Norm2AllModes::createInstance((char *)0x0,name,errorCode);
  *puVar3 = pNVar2;
LAB_002cd558:
  ucln_common_registerCleanup_63(UCLN_COMMON_LOADED_NORMALIZER2,uprv_loaded_normalizer2_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initSingletons(const char *what, UErrorCode &errorCode) {
#if !NORM2_HARDCODE_NFC_DATA
    if (uprv_strcmp(what, "nfc") == 0) {
        nfcSingleton    = Norm2AllModes::createInstance(NULL, "nfc", errorCode);
    } else
#endif
    if (uprv_strcmp(what, "nfkc") == 0) {
        nfkcSingleton    = Norm2AllModes::createInstance(NULL, "nfkc", errorCode);
    } else if (uprv_strcmp(what, "nfkc_cf") == 0) {
        nfkc_cfSingleton = Norm2AllModes::createInstance(NULL, "nfkc_cf", errorCode);
    } else {
        U_ASSERT(FALSE);   // Unknown singleton
    }
    ucln_common_registerCleanup(UCLN_COMMON_LOADED_NORMALIZER2, uprv_loaded_normalizer2_cleanup);
}